

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

FILE * __thiscall fmt::File::fdopen(File *this,int __fd,char *__modes)

{
  undefined8 uVar1;
  undefined4 in_register_00000034;
  int *piVar2;
  FILE *f;
  BufferedFile *file;
  BufferedFile *this_00;
  int error_code;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  CStringRef in_stack_ffffffffffffffd0;
  BasicCStringRef<char> local_28;
  FILE *local_20;
  char *local_18;
  int *local_10;
  File *local_8;
  
  piVar2 = (int *)CONCAT44(in_register_00000034,__fd);
  this_00 = (BufferedFile *)this;
  local_18 = __modes;
  local_10 = piVar2;
  local_8 = this;
  local_20 = ::fdopen(*piVar2,__modes);
  if (local_20 != (FILE *)0x0) {
    BufferedFile::BufferedFile(this_00,(FILE *)local_20);
    *piVar2 = -1;
    return (FILE *)this;
  }
  uVar1 = __cxa_allocate_exception(0x18);
  error_code = (int)((ulong)piVar2 >> 0x20);
  __errno_location();
  BasicCStringRef<char>::BasicCStringRef(&local_28,"cannot associate stream with file descriptor");
  SystemError::SystemError
            ((SystemError *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),error_code
             ,in_stack_ffffffffffffffd0);
  __cxa_throw(uVar1,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

fmt::BufferedFile fmt::File::fdopen(const char *mode) {
  // Don't retry as fdopen doesn't return EINTR.
  FILE *f = FMT_POSIX_CALL(fdopen(fd_, mode));
  if (!f)
    FMT_THROW(SystemError(errno, "cannot associate stream with file descriptor"));
  BufferedFile file(f);
  fd_ = -1;
  return file;
}